

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCompoundCollisionAlgorithm.cpp
# Opt level: O0

void MycollideTT(btDbvtNode *root0,btDbvtNode *root1,btTransform *xform,
                btCompoundCompoundLeafCallback *callback)

{
  int iVar1;
  bool bVar2;
  sStkNN *psVar3;
  long *in_RCX;
  btDbvtNode *in_RSI;
  btDbvtNode *in_RDI;
  sStkNN p;
  btAlignedObjectArray<btDbvt::sStkNN> stkStack;
  int treshold;
  int depth;
  btAlignedObjectArray<btDbvt::sStkNN> *in_stack_fffffffffffffe80;
  sStkNN *in_stack_fffffffffffffe90;
  sStkNN *in_stack_fffffffffffffe98;
  btAlignedObjectArray<btDbvt::sStkNN> *in_stack_fffffffffffffea0;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  sStkNN local_118;
  sStkNN local_108;
  sStkNN local_f8;
  sStkNN local_e8;
  sStkNN local_d8;
  sStkNN local_c8;
  sStkNN local_b8;
  sStkNN local_a8;
  sStkNN local_98;
  btDbvtNode *local_88;
  btDbvtNode *pbStack_80;
  sStkNN local_78 [2];
  sStkNN local_58;
  btAlignedObjectArray<btDbvt::sStkNN> local_48;
  int local_28;
  int local_24;
  long *local_20;
  btDbvtNode *local_10;
  btDbvtNode *local_8;
  
  if ((in_RDI != (btDbvtNode *)0x0) && (in_RSI != (btDbvtNode *)0x0)) {
    local_24 = 1;
    local_28 = 0x7c;
    local_20 = in_RCX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    btAlignedObjectArray<btDbvt::sStkNN>::btAlignedObjectArray(in_stack_fffffffffffffe80);
    btDbvt::sStkNN::sStkNN(&local_58);
    btAlignedObjectArray<btDbvt::sStkNN>::resize
              (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               in_stack_fffffffffffffe90);
    btDbvt::sStkNN::sStkNN(local_78,local_8,local_10);
    psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,0);
    psVar3->a = local_78[0].a;
    psVar3->b = local_78[0].b;
    do {
      local_24 = local_24 + -1;
      psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,local_24);
      local_88 = psVar3->a;
      pbStack_80 = psVar3->b;
      bVar2 = MyIntersect((btDbvtAabbMm *)
                          CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          (btDbvtAabbMm *)
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                          (btTransform *)
                          CONCAT17(in_stack_fffffffffffffec7,
                                   CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
      in_stack_fffffffffffffed4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffed4);
      if (bVar2) {
        if (local_28 < local_24) {
          in_stack_fffffffffffffed0 = btAlignedObjectArray<btDbvt::sStkNN>::size(&local_48);
          in_stack_fffffffffffffecc = in_stack_fffffffffffffed0 * 2;
          btDbvt::sStkNN::sStkNN(&local_98);
          btAlignedObjectArray<btDbvt::sStkNN>::resize
                    (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                     in_stack_fffffffffffffe90);
          in_stack_fffffffffffffec8 = btAlignedObjectArray<btDbvt::sStkNN>::size(&local_48);
          local_28 = in_stack_fffffffffffffec8 + -4;
        }
        in_stack_fffffffffffffec7 = btDbvtNode::isinternal((btDbvtNode *)0x1913c9);
        if ((bool)in_stack_fffffffffffffec7) {
          in_stack_fffffffffffffec6 = btDbvtNode::isinternal((btDbvtNode *)0x1913e9);
          if ((bool)in_stack_fffffffffffffec6) {
            btDbvt::sStkNN::sStkNN
                      (&local_a8,(local_88->field_2).childs[0],(pbStack_80->field_2).childs[0]);
            iVar1 = local_24;
            local_24 = local_24 + 1;
            psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
            psVar3->a = local_a8.a;
            psVar3->b = local_a8.b;
            btDbvt::sStkNN::sStkNN
                      (&local_b8,(local_88->field_2).childs[1],(pbStack_80->field_2).childs[0]);
            iVar1 = local_24;
            local_24 = local_24 + 1;
            psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
            psVar3->a = local_b8.a;
            psVar3->b = local_b8.b;
            btDbvt::sStkNN::sStkNN
                      (&local_c8,(local_88->field_2).childs[0],(pbStack_80->field_2).childs[1]);
            iVar1 = local_24;
            local_24 = local_24 + 1;
            psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
            psVar3->a = local_c8.a;
            psVar3->b = local_c8.b;
            btDbvt::sStkNN::sStkNN
                      (&local_d8,(local_88->field_2).childs[1],(pbStack_80->field_2).childs[1]);
            iVar1 = local_24;
            local_24 = local_24 + 1;
            in_stack_fffffffffffffea0 =
                 (btAlignedObjectArray<btDbvt::sStkNN> *)
                 btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
            *(btDbvtNode **)in_stack_fffffffffffffea0 = local_d8.a;
            *(btDbvtNode **)&in_stack_fffffffffffffea0->m_capacity = local_d8.b;
          }
          else {
            btDbvt::sStkNN::sStkNN(&local_e8,(local_88->field_2).childs[0],pbStack_80);
            iVar1 = local_24;
            local_24 = local_24 + 1;
            in_stack_fffffffffffffe98 =
                 btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
            in_stack_fffffffffffffe98->a = local_e8.a;
            in_stack_fffffffffffffe98->b = local_e8.b;
            btDbvt::sStkNN::sStkNN(&local_f8,(local_88->field_2).childs[1],pbStack_80);
            iVar1 = local_24;
            local_24 = local_24 + 1;
            in_stack_fffffffffffffe90 =
                 btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
            in_stack_fffffffffffffe90->a = local_f8.a;
            in_stack_fffffffffffffe90->b = local_f8.b;
          }
        }
        else {
          bVar2 = btDbvtNode::isinternal((btDbvtNode *)0x191651);
          if (bVar2) {
            btDbvt::sStkNN::sStkNN(&local_108,local_88,(pbStack_80->field_2).childs[0]);
            iVar1 = local_24;
            local_24 = local_24 + 1;
            psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
            psVar3->a = local_108.a;
            psVar3->b = local_108.b;
            btDbvt::sStkNN::sStkNN(&local_118,local_88,(pbStack_80->field_2).childs[1]);
            iVar1 = local_24;
            local_24 = local_24 + 1;
            psVar3 = btAlignedObjectArray<btDbvt::sStkNN>::operator[](&local_48,iVar1);
            psVar3->a = local_118.a;
            psVar3->b = local_118.b;
          }
          else {
            (**(code **)(*local_20 + 0x10))(local_20,local_88,pbStack_80);
          }
        }
      }
    } while (local_24 != 0);
    btAlignedObjectArray<btDbvt::sStkNN>::~btAlignedObjectArray
              ((btAlignedObjectArray<btDbvt::sStkNN> *)0x19175f);
  }
  return;
}

Assistant:

static inline void		MycollideTT(	const btDbvtNode* root0,
								  const btDbvtNode* root1,
								  const btTransform& xform,
								  btCompoundCompoundLeafCallback* callback)
{

		if(root0&&root1)
		{
			int								depth=1;
			int								treshold=btDbvt::DOUBLE_STACKSIZE-4;
			btAlignedObjectArray<btDbvt::sStkNN>	stkStack;
			stkStack.resize(btDbvt::DOUBLE_STACKSIZE);
			stkStack[0]=btDbvt::sStkNN(root0,root1);
			do	{
				btDbvt::sStkNN	p=stkStack[--depth];
				if(MyIntersect(p.a->volume,p.b->volume,xform))
				{
					if(depth>treshold)
					{
						stkStack.resize(stkStack.size()*2);
						treshold=stkStack.size()-4;
					}
					if(p.a->isinternal())
					{
						if(p.b->isinternal())
						{					
							stkStack[depth++]=btDbvt::sStkNN(p.a->childs[0],p.b->childs[0]);
							stkStack[depth++]=btDbvt::sStkNN(p.a->childs[1],p.b->childs[0]);
							stkStack[depth++]=btDbvt::sStkNN(p.a->childs[0],p.b->childs[1]);
							stkStack[depth++]=btDbvt::sStkNN(p.a->childs[1],p.b->childs[1]);
						}
						else
						{
							stkStack[depth++]=btDbvt::sStkNN(p.a->childs[0],p.b);
							stkStack[depth++]=btDbvt::sStkNN(p.a->childs[1],p.b);
						}
					}
					else
					{
						if(p.b->isinternal())
						{
							stkStack[depth++]=btDbvt::sStkNN(p.a,p.b->childs[0]);
							stkStack[depth++]=btDbvt::sStkNN(p.a,p.b->childs[1]);
						}
						else
						{
							callback->Process(p.a,p.b);
						}
					}
				}
			} while(depth);
		}
}